

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderStorageBufferObjectTests.cpp
# Opt level: O0

long __thiscall gl4cts::anon_unknown_0::NegativeGLSLCompileTime::Run(NegativeGLSLCompileTime *this)

{
  bool bVar1;
  int binding;
  int binding_00;
  int binding_01;
  allocator<char> local_2b9;
  string local_2b8;
  allocator<char> local_291;
  string local_290;
  allocator<char> local_269;
  string local_268;
  allocator<char> local_241;
  string local_240;
  allocator<char> local_219;
  string local_218;
  allocator<char> local_1f1;
  string local_1f0;
  allocator<char> local_1c9;
  string local_1c8;
  allocator<char> local_1a1;
  string local_1a0;
  allocator<char> local_179;
  string local_178;
  allocator<char> local_151;
  string local_150;
  allocator<char> local_129;
  string local_128;
  allocator<char> local_101;
  string local_100;
  allocator<char> local_d9;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  allocator<char> local_41;
  string local_40;
  uint local_1c;
  NegativeGLSLCompileTime *pNStack_18;
  GLint bindings;
  NegativeGLSLCompileTime *this_local;
  
  pNStack_18 = this;
  glu::CallLogWrapper::glGetIntegerv
            (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x90dd,(GLint *)&local_1c);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"\nbuffer Buffer { int x = 10; };\nvoid main() {\n  x = 0;\n}",
             &local_41);
  bVar1 = Compile(this,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    gl4cts::(anonymous_namespace)::NegativeGLSLCompileTime::Shader1_abi_cxx11_
              (&local_78,(NegativeGLSLCompileTime *)0xffffffff,binding);
    bVar1 = Compile(this,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      gl4cts::(anonymous_namespace)::NegativeGLSLCompileTime::Shader1_abi_cxx11_
                (&local_98,(NegativeGLSLCompileTime *)(ulong)local_1c,binding_00);
      bVar1 = Compile(this,&local_98);
      std::__cxx11::string::~string((string *)&local_98);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        gl4cts::(anonymous_namespace)::NegativeGLSLCompileTime::Shader2_abi_cxx11_
                  (&local_b8,(NegativeGLSLCompileTime *)(ulong)(local_1c - 2),binding_01);
        bVar1 = Compile(this,&local_b8);
        std::__cxx11::string::~string((string *)&local_b8);
        if (((bVar1 ^ 0xffU) & 1) == 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_d8,"\nbuffer int x;\nvoid main() {\n  x = 0;\n}",&local_d9);
          bVar1 = Compile(this,&local_d8);
          std::__cxx11::string::~string((string *)&local_d8);
          std::allocator<char>::~allocator(&local_d9);
          if (((bVar1 ^ 0xffU) & 1) == 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_100,
                       "\nbuffer Buffer { int y; };\nvoid main() {\n  y = 0;\n  buffer int x = 0;\n}"
                       ,&local_101);
            bVar1 = Compile(this,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::allocator<char>::~allocator(&local_101);
            if (((bVar1 ^ 0xffU) & 1) == 0) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_128,
                         "\nbuffer Buffer { int y; };\nvoid Modify(buffer int a) {\n  atomicAdd(a, 1);\n}\nvoid main() {\n  Modify(y);\n}"
                         ,&local_129);
              bVar1 = Compile(this,&local_128);
              std::__cxx11::string::~string((string *)&local_128);
              std::allocator<char>::~allocator(&local_129);
              if (((bVar1 ^ 0xffU) & 1) == 0) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_150,
                           "\nlayout(std430) uniform UBO { int x; };\nbuffer SSBO { int y; };\nvoid main() {\n  y = x;\n}"
                           ,&local_151);
                bVar1 = Compile(this,&local_150);
                std::__cxx11::string::~string((string *)&local_150);
                std::allocator<char>::~allocator(&local_151);
                if (((bVar1 ^ 0xffU) & 1) == 0) {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_178,
                             "\nbuffer SSBO {\n  layout(std430) int x;\n};\nvoid main() {\n  x = 0;\n}"
                             ,&local_179);
                  bVar1 = Compile(this,&local_178);
                  std::__cxx11::string::~string((string *)&local_178);
                  std::allocator<char>::~allocator(&local_179);
                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_1a0,
                               "\nbuffer SSBO {\n  layout(binding = 1) int x;\n};\nvoid main() {\n  x = 0;\n}"
                               ,&local_1a1);
                    bVar1 = Compile(this,&local_1a0);
                    std::__cxx11::string::~string((string *)&local_1a0);
                    std::allocator<char>::~allocator(&local_1a1);
                    if (((bVar1 ^ 0xffU) & 1) == 0) {
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_1c8,
                                 "\nreadonly buffer SSBO {\n  int x;\n};\nvoid main() {\n  x = 0;\n}"
                                 ,&local_1c9);
                      bVar1 = Compile(this,&local_1c8);
                      std::__cxx11::string::~string((string *)&local_1c8);
                      std::allocator<char>::~allocator(&local_1c9);
                      if (((bVar1 ^ 0xffU) & 1) == 0) {
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_1f0,
                                   "\nbuffer SSBO {\n  int x;\n};\nwriteonly buffer SSBO2 {\n  int y;\n};\nvoid main() {\n  x = y;\n}"
                                   ,&local_1f1);
                        bVar1 = Compile(this,&local_1f0);
                        std::__cxx11::string::~string((string *)&local_1f0);
                        std::allocator<char>::~allocator(&local_1f1);
                        if (((bVar1 ^ 0xffU) & 1) == 0) {
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string<std::allocator<char>>
                                    ((string *)&local_218,
                                     "\nbuffer SSBO {\n  int x;\n};\nbuffer SSBO2 {\n  writeonly int y;\n  readonly int z;\n};\nvoid main() {\n  x = y;\n  z = 0;\n}"
                                     ,&local_219);
                          bVar1 = Compile(this,&local_218);
                          std::__cxx11::string::~string((string *)&local_218);
                          std::allocator<char>::~allocator(&local_219);
                          if (((bVar1 ^ 0xffU) & 1) == 0) {
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)&local_240,
                                       "\nbuffer SSBO {\n  int x;\n};\nreadonly buffer SSBO2 {\n  writeonly int y;\n};\nvoid main() {\n  x = y;\n}"
                                       ,&local_241);
                            bVar1 = Compile(this,&local_240);
                            std::__cxx11::string::~string((string *)&local_240);
                            std::allocator<char>::~allocator(&local_241);
                            if (((bVar1 ^ 0xffU) & 1) == 0) {
                              std::allocator<char>::allocator();
                              std::__cxx11::string::string<std::allocator<char>>
                                        ((string *)&local_268,
                                         "\nlayout(binding = 1) buffer;\nbuffer SSBO {\n  int x;\n};\nvoid main() {\n  x = 0;\n}"
                                         ,&local_269);
                              bVar1 = Compile(this,&local_268);
                              std::__cxx11::string::~string((string *)&local_268);
                              std::allocator<char>::~allocator(&local_269);
                              if (((bVar1 ^ 0xffU) & 1) == 0) {
                                std::allocator<char>::allocator();
                                std::__cxx11::string::string<std::allocator<char>>
                                          ((string *)&local_290,
                                           "\nbuffer Buffer { int x; };\nint y;\nvoid main() {\n  atomicAdd(x, 1);\n  atomicAdd(y, 2);\n}"
                                           ,&local_291);
                                bVar1 = Compile(this,&local_290);
                                std::__cxx11::string::~string((string *)&local_290);
                                std::allocator<char>::~allocator(&local_291);
                                if (((bVar1 ^ 0xffU) & 1) == 0) {
                                  std::allocator<char>::allocator();
                                  std::__cxx11::string::string<std::allocator<char>>
                                            ((string *)&local_2b8,
                                             "\nbuffer b {\n  vec4 x[10];\n};\nvoid main() {\n  vec4 y = vec4(x);\n}"
                                             ,&local_2b9);
                                  bVar1 = Compile(this,&local_2b8);
                                  std::__cxx11::string::~string((string *)&local_2b8);
                                  std::allocator<char>::~allocator(&local_2b9);
                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                    this_local = (NegativeGLSLCompileTime *)0x0;
                                  }
                                  else {
                                    this_local = (NegativeGLSLCompileTime *)&DAT_ffffffffffffffff;
                                  }
                                }
                                else {
                                  this_local = (NegativeGLSLCompileTime *)&DAT_ffffffffffffffff;
                                }
                              }
                              else {
                                this_local = (NegativeGLSLCompileTime *)&DAT_ffffffffffffffff;
                              }
                            }
                            else {
                              this_local = (NegativeGLSLCompileTime *)&DAT_ffffffffffffffff;
                            }
                          }
                          else {
                            this_local = (NegativeGLSLCompileTime *)&DAT_ffffffffffffffff;
                          }
                        }
                        else {
                          this_local = (NegativeGLSLCompileTime *)&DAT_ffffffffffffffff;
                        }
                      }
                      else {
                        this_local = (NegativeGLSLCompileTime *)&DAT_ffffffffffffffff;
                      }
                    }
                    else {
                      this_local = (NegativeGLSLCompileTime *)&DAT_ffffffffffffffff;
                    }
                  }
                  else {
                    this_local = (NegativeGLSLCompileTime *)&DAT_ffffffffffffffff;
                  }
                }
                else {
                  this_local = (NegativeGLSLCompileTime *)&DAT_ffffffffffffffff;
                }
              }
              else {
                this_local = (NegativeGLSLCompileTime *)&DAT_ffffffffffffffff;
              }
            }
            else {
              this_local = (NegativeGLSLCompileTime *)&DAT_ffffffffffffffff;
            }
          }
          else {
            this_local = (NegativeGLSLCompileTime *)&DAT_ffffffffffffffff;
          }
        }
        else {
          this_local = (NegativeGLSLCompileTime *)&DAT_ffffffffffffffff;
        }
      }
      else {
        this_local = (NegativeGLSLCompileTime *)&DAT_ffffffffffffffff;
      }
    }
    else {
      this_local = (NegativeGLSLCompileTime *)&DAT_ffffffffffffffff;
    }
  }
  else {
    this_local = (NegativeGLSLCompileTime *)&DAT_ffffffffffffffff;
  }
  return (long)this_local;
}

Assistant:

virtual long Run()
	{
		GLint bindings;
		glGetIntegerv(GL_MAX_SHADER_STORAGE_BUFFER_BINDINGS, &bindings);

		//  initialization of buffer block member 'x' not allowed
		if (!Compile(NL "buffer Buffer { int x = 10; };" NL "void main() {" NL "  x = 0;" NL "}"))
			return ERROR;

		//  syntax error, unexpected '-', expecting integer constant or unsigned integer constant at token "-"
		if (!Compile(Shader1(-1)))
			return ERROR;
		//  invalid value 96 for layout specifier 'binding'
		if (!Compile(Shader1(bindings)))
			return ERROR;

		//  invalid value 98 for layout specifier 'binding'
		if (!Compile(Shader2(bindings - 2)))
			return ERROR;

		//  OpenGL does not allow declaring buffer variable 'x' in the global scope. Use buffer blocks instead
		if (!Compile(NL "buffer int x;" NL "void main() {" NL "  x = 0;" NL "}"))
			return ERROR;

		// OpenGL requires buffer variables to be declared in a shader storage block in the global scope
		if (!Compile(NL "buffer Buffer { int y; };" NL "void main() {" NL "  y = 0;" NL "  buffer int x = 0;" NL "}"))
			return ERROR;

		//  OpenGL does not allow a parameter to be a buffer
		if (!Compile(NL "buffer Buffer { int y; };" NL "void Modify(buffer int a) {" NL "  atomicAdd(a, 1);" NL "}" NL
						"void main() {" NL "  Modify(y);" NL "}"))
			return ERROR;

		//  layout specifier 'std430', incompatible with 'uniform blocks'
		if (!Compile(NL "layout(std430) uniform UBO { int x; };" NL "buffer SSBO { int y; };" NL "void main() {" NL
						"  y = x;" NL "}"))
			return ERROR;

		//  unknown layout specifier 'std430'
		if (!Compile(NL "buffer SSBO {" NL "  layout(std430) int x;" NL "};" NL "void main() {" NL "  x = 0;" NL "}"))
			return ERROR;

		//  unknown layout specifier 'binding = 1'
		if (!Compile(NL "buffer SSBO {" NL "  layout(binding = 1) int x;" NL "};" NL "void main() {" NL "  x = 0;" NL
						"}"))
			return ERROR;

		//  OpenGL does not allow writing to readonly variable 'x'
		if (!Compile(NL "readonly buffer SSBO {" NL "  int x;" NL "};" NL "void main() {" NL "  x = 0;" NL "}"))
			return ERROR;

		//  OpenGL does not allow reading writeonly variable 'y'
		if (!Compile(NL "buffer SSBO {" NL "  int x;" NL "};" NL "writeonly buffer SSBO2 {" NL "  int y;" NL "};" NL
						"void main() {" NL "  x = y;" NL "}"))
			return ERROR;

		//  OpenGL does not allow writing to readonly variable 'z'
		if (!Compile(NL "buffer SSBO {" NL "  int x;" NL "};" NL "buffer SSBO2 {" NL "  writeonly int y;" NL
						"  readonly int z;" NL "};" NL "void main() {" NL "  x = y;" NL "  z = 0;" NL "}"))
			return ERROR;

		//  OpenGL does not allow having both readonly and writeonly qualifiers on a variable
		if (!Compile(NL "buffer SSBO {" NL "  int x;" NL "};" NL "readonly buffer SSBO2 {" NL "  writeonly int y;" NL
						"};" NL "void main() {" NL "  x = y;" NL "}"))
			return ERROR;

		// ["layout(binding = 1) buffer;" should cause compile-time error
		if (!Compile(NL "layout(binding = 1) buffer;" NL "buffer SSBO {" NL "  int x;" NL "};" NL "void main() {" NL
						"  x = 0;" NL "}"))
			return ERROR;

		// ["  atomicAdd(y, 2);"  should cause compile-time error
		if (!Compile(NL "buffer Buffer { int x; };" NL "int y;" NL "void main() {" NL "  atomicAdd(x, 1);" NL
						"  atomicAdd(y, 2);" //
					 NL "}"))
			return ERROR;

		if (!Compile( // can't construct vector from an array
				NL "buffer b {" NL "  vec4 x[10];" NL "};" NL "void main() {" NL "  vec4 y = vec4(x);" NL "}"))
			return ERROR;

		return NO_ERROR;
	}